

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDriver.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  __pid_t __pid;
  __pid_t _Var5;
  char *pcVar6;
  int *piVar7;
  ulong uVar8;
  FILE *pFVar9;
  undefined8 uVar10;
  int iVar11;
  char *pcVar12;
  size_t sVar13;
  undefined1 *__command;
  undefined4 uVar14;
  uint uVar15;
  TLabTest TVar16;
  sigaction new;
  rusage rusage;
  uint local_234;
  ulong local_230;
  char **local_228;
  char *local_220;
  timespec local_218;
  _union_1457 local_200;
  undefined8 local_1f8;
  _union_1457 local_1f0;
  sigset_t local_1e8;
  undefined4 local_168;
  rusage local_158;
  sigaction local_c8;
  
  local_220 = *argv;
  if ((2 < argc) && (iVar3 = strcmp(argv[1],"-a"), iVar3 == 0)) {
    argv = argv + 1;
    UserTestAll = '\x01';
    argc = argc + -1;
  }
  if (((3 < argc) && (iVar3 = strcmp(argv[1],"-m"), iVar3 == 0)) &&
     (iVar3 = atoi(argv[2]), iVar3 != 0)) {
    argv = argv + 2;
    UserMemoryLimit = iVar3 << 10;
    argc = argc + -2;
  }
  if (((3 < argc) && (iVar3 = strcmp(argv[1],"-t"), iVar3 == 0)) &&
     (iVar3 = atoi(argv[2]), iVar3 != 0)) {
    argv = argv + 2;
    argc = argc + -2;
    UserTimeout = iVar3;
  }
  if ((argc < 3) || (iVar3 = strcmp(argv[1],"-e"), iVar3 != 0)) {
    PrintWithoutBuffering("\nKOI FIT NSU Lab Tester (c) 2009-2020 by Evgueni Petrov\n");
    if (argc < 2) {
      pcVar12 = "\nTo test mylab.exe, do %s mylab.exe\n";
      pcVar6 = local_220;
    }
    else {
      pcVar6 = GetTesterName();
      PrintWithoutBuffering("\nTesting %s...\n",pcVar6);
      uVar15 = 1;
      local_230 = 0;
      local_228 = argv;
      do {
        iVar11 = uVar15 - 1;
        iVar3 = GetTestCount();
        if (iVar3 <= iVar11) break;
        uVar4 = GetTestCount();
        uVar10 = 0;
        PrintWithoutBuffering("TEST %d/%d: ",(ulong)uVar15,(ulong)uVar4);
        TVar16 = GetLabTest(iVar11);
        iVar3 = (*TVar16.Feeder)();
        if ((iVar3 != 0) && (uVar10 = 0xffffffff, UserTestAll != '\x01')) break;
        pcVar6 = argv[1];
        sVar13 = (size_t)UserMemoryLimit;
        local_1f8 = uVar10;
        if ((long)sVar13 < 0) {
          sVar13 = GetTestMemoryLimit();
        }
        uVar4 = UserTimeout;
        if (UserTimeout < 0) {
          uVar4 = GetTestTimeout();
        }
        iVar3 = snprintf(GetRunnerCommand_runnerCommand,0x1000,"%s -m %zu -t %d -e %s",local_220,
                         sVar13 + 0x3ff >> 10,(ulong)uVar4,pcVar6);
        pcVar6 = "\nInternal error: snprintf returned negative value\n";
        if ((iVar3 < 0) ||
           (pcVar6 = "\nInternal error: snprintf stopped at the end of buffer\n", iVar3 == 0xfff)) {
          PrintWithoutBuffering(pcVar6);
          bVar1 = true;
          __command = (char *)0x0;
        }
        else {
          bVar1 = false;
          __command = GetRunnerCommand_runnerCommand;
        }
        bVar2 = false;
        if (!bVar1) {
          gettimeofday((timeval *)&local_1f0,(__timezone_ptr_t)0x0);
          uVar8 = local_1e8.__val[0];
          local_200 = local_1f0;
          iVar3 = system(__command);
          argv = local_228;
          if (iVar3 == 0) {
            iVar3 = local_200._0_4_ * -1000;
            gettimeofday((timeval *)&local_1f0,(__timezone_ptr_t)0x0);
            PrintWithoutBuffering
                      ("%.0f ms, ",
                       (double)((iVar3 + ((int)(SUB168(SEXT816((long)uVar8) *
                                                       SEXT816(-0x20c49ba5e353f7cf),8) >> 7) -
                                         (SUB164(SEXT816((long)uVar8) * SEXT816(-0x20c49ba5e353f7cf)
                                                 ,0xc) >> 0x1f)) +
                                 ((int)(SUB168(SEXT816(0x20c49ba5e353f7cf) *
                                               SEXT816((long)local_1e8.__val[0]),8) >> 7) -
                                 (SUB164(SEXT816(0x20c49ba5e353f7cf) *
                                         SEXT816((long)local_1e8.__val[0]),0xc) >> 0x1f)) +
                                 local_1f0._0_4_ * 1000 + 86400000) % 86400000));
            TVar16 = GetLabTest(iVar11);
            iVar11 = (*TVar16.Checker)();
            iVar3 = (int)local_1f8;
            argv = local_228;
            if ((iVar11 == 0) || (iVar3 = -1, UserTestAll == '\x01')) {
              local_230 = (ulong)((int)local_230 + iVar3 + 1);
              bVar2 = true;
            }
            else {
              bVar2 = false;
            }
          }
        }
        uVar15 = uVar15 + 1;
      } while (bVar2);
      iVar3 = GetTestCount();
      pcVar6 = argv[1];
      if (iVar3 <= (int)local_230) {
        PrintWithoutBuffering
                  ("\n:-)\n\nExecutable file %s passed all tests.\nPlease review the source code with your teaching assistant.\n"
                   ,pcVar6);
        return 0;
      }
      pcVar12 = 
      "\n:-(\n\nExecutable file %s failed for input file in.txt in the current directory.\nPlease fix and try again.\n"
      ;
    }
    PrintWithoutBuffering(pcVar12,pcVar6);
    return 1;
  }
  pcVar6 = argv[2];
  memset(&local_1f0,0,0x98);
  local_1f0.sa_handler = SigchldTrap;
  sigemptyset(&local_1e8);
  local_168 = 1;
  iVar3 = sigaction(0x11,(sigaction *)&local_1f0,&local_c8);
  if (iVar3 != 0) goto LAB_00102e79;
  fflush(_stdout);
  iVar3 = access(".",7);
  if (iVar3 == -1) {
    pcVar6 = "access";
LAB_00102e57:
    ReportSystemError(pcVar6);
  }
  else {
    __pid = fork();
    if (__pid == -1) {
      pcVar6 = "fork";
      goto LAB_00102e57;
    }
    if (__pid == 0) {
      pFVar9 = freopen("in.txt","r",_stdin);
      if ((pFVar9 == (FILE *)0x0) ||
         (pFVar9 = freopen("out.txt","w",_stdout), pFVar9 == (FILE *)0x0)) {
        pcVar6 = "freopen";
      }
      else {
        iVar3 = execl(pcVar6,pcVar6,0);
        if (iVar3 != -1) {
          __assert_fail("ret == -1",
                        "/workspace/llm4binary/github/license_c_cmakelists/Evgueni-Petrov-aka-espetrov[P]TestDriver/testDriver.c"
                        ,0x218,"int _LaunchLabExecutable(char *)");
        }
        pcVar6 = "execl";
      }
      ReportSystemError(pcVar6);
      exit(1);
    }
    memset(&local_158,0,0x90);
    local_218.tv_sec = 0;
    local_218.tv_nsec = 0;
    iVar3 = UserTimeout;
    if (UserTimeout < 0) {
      iVar3 = GetTestTimeout();
    }
    local_218.tv_sec = (__time_t)(iVar3 / 1000);
    iVar3 = UserTimeout;
    if (UserTimeout < 0) {
      iVar3 = GetTestTimeout();
    }
    local_218.tv_nsec =
         (long)(int)((iVar3 + ((uint)((ulong)((long)iVar3 * 0x10624dd3) >> 0x26) - (iVar3 >> 0x1f))
                              * -1000) * 1000000);
    do {
      if ((local_218.tv_sec < 1) && (local_218.tv_nsec < 1)) {
        uVar14 = 0;
        break;
      }
      local_234 = 0;
      _Var5 = wait4(__pid,&local_234,1,&local_158);
      if (_Var5 == -1) {
        argv = (char **)0x4;
LAB_00102e24:
        bVar1 = false;
      }
      else if (_Var5 == 0) {
        iVar3 = nanosleep(&local_218,&local_218);
        if (iVar3 == 0) {
          argv = (char **)0x0;
          goto LAB_00102e24;
        }
        piVar7 = __errno_location();
        bVar1 = true;
        if (*piVar7 != 4) {
          __assert_fail("errno == EINTR",
                        "/workspace/llm4binary/github/license_c_cmakelists/Evgueni-Petrov-aka-espetrov[P]TestDriver/testDriver.c"
                        ,0x1ee,"int WaitForProcess(pid_t, struct timespec *, struct rusage *)");
        }
      }
      else {
        if ((local_234 & 0x7f) != 0) {
          argv = (char **)(ulong)((uint)((int)((local_234 & 0x7f) * 0x1000000 + 0x1000000) <
                                        0x2000000) * 3 + 1);
          goto LAB_00102e24;
        }
        bVar1 = false;
        argv = (char **)(ulong)(((local_234 & 0xff00) == 0) + 2);
      }
      uVar14 = SUB84(argv,0);
    } while (bVar1);
    switch(uVar14) {
    case 0:
      iVar3 = UserTimeout;
      if (UserTimeout < 0) {
        iVar3 = GetTestTimeout();
      }
      PrintWithoutBuffering
                ("\nExecutable file \"%s\" didn\'t terminate in %d seconds\n",pcVar6,
                 (ulong)(iVar3 + 999) / 1000);
      iVar11 = kill(__pid,9);
      iVar3 = 1;
      if (iVar11 != 0) {
        ReportSystemError("kill");
      }
      goto LAB_00102e61;
    case 1:
      pcVar12 = "\nExecutable file \"%s\" terminated with exception\n";
      break;
    case 2:
      pcVar12 = "\nExecutable file \"%s\" terminated with return code != 0\n";
      break;
    default:
      uVar8 = (ulong)UserMemoryLimit;
      if ((long)uVar8 < 0) {
        uVar8 = GetTestMemoryLimit();
      }
      iVar3 = 0;
      if ((ulong)(local_158.ru_maxrss << 10) <= uVar8) goto LAB_00102e61;
      iVar3 = UserMemoryLimit;
      if (UserMemoryLimit < 0) {
        sVar13 = GetTestMemoryLimit();
        iVar3 = (int)sVar13;
      }
      PrintWithoutBuffering
                ("\nExecutable file \"%s\" used %dKB > %dKB\n",pcVar6,
                 (ulong)((uint)(local_158.ru_maxrss << 10) | 0x3e0) / 1000,
                 (ulong)(iVar3 + 999) / 1000);
      goto LAB_00102e5c;
    case 4:
      pcVar6 = "wait4";
      goto LAB_00102e57;
    }
    PrintWithoutBuffering(pcVar12,pcVar6);
  }
LAB_00102e5c:
  iVar3 = 1;
LAB_00102e61:
  iVar11 = sigaction(0x11,&local_c8,(sigaction *)0x0);
  if (iVar11 == 0) {
    return iVar3;
  }
LAB_00102e79:
  ReportSystemError("sigaction");
  return -1;
}

Assistant:

int main(int argc, char* argv[])
{
    int i, count, fail;
    const char* runnerExe = argv[0];

    if (argc >= 3 && strcmp(argv[1], "-a") == 0) {
        UserTestAll = 1;
        argv++;
        argc--;
    }
    if (argc >= 4 && strcmp(argv[1], "-m") == 0 && atoi(argv[2]) != 0) {
        UserMemoryLimit = atoi(argv[2])*1024;
        argv += 2;
        argc -= 2;
    }
    if (argc >= 4 && strcmp(argv[1], "-t") == 0 && atoi(argv[2]) != 0) {
        UserTimeout = atoi(argv[2]);
        argv += 2;
        argc -= 2;
    }
    if (argc >= 3 && strcmp(argv[1], "-e") == 0) {
        return LaunchLabExecutable(argv[2]);
    }

    PrintWithoutBuffering("\nKOI FIT NSU Lab Tester (c) 2009-2020 by Evgueni Petrov\n");

    if (argc < 2) {
        PrintWithoutBuffering("\nTo test mylab.exe, do %s mylab.exe\n", runnerExe);
        return 1;
    }

    PrintWithoutBuffering("\nTesting %s...\n", GetTesterName());

    for (i = 0, count = 0, fail = 0; i < GetTestCount(); i++, fail = 0) {
        PrintWithoutBuffering("TEST %d/%d: ", i+1, GetTestCount());
        if (GetLabTest(i).Feeder() != 0) {
            if (!UserTestAll) {
                break;
            }
            fail = 1;
        }
        const char* runnerCommand = GetRunnerCommand(runnerExe, argv[1]);
        if (!runnerCommand) {
            break;
        }
        double ms0 = GetTickCount();
        if (system(runnerCommand) != 0) {
            break;
        }
        double ms1 = GetTickCount();
        int millisecondsPerDay = 1000 * 60 * 60 * 24;
        double msElapsed = ((int)(ms1 - ms0) + millisecondsPerDay) % millisecondsPerDay;
        PrintWithoutBuffering("%.0f ms, ", msElapsed);
        if (GetLabTest(i).Checker() != 0) {
            if (!UserTestAll) {
                break;
            }
            fail = 1;
        }
        count += 1 - fail;
    }

    if (count < GetTestCount()) {
        PrintWithoutBuffering("\n:-(\n\n"
        "Executable file %s failed for input file in.txt in the current directory.\n"
        "Please fix and try again.\n", argv[1]);
        return 1;
    } else {
        PrintWithoutBuffering("\n:-)\n\n"
        "Executable file %s passed all tests.\n"
        "Please review the source code with your teaching assistant.\n", argv[1]);
        return 0;
    }
}